

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

optional<pbrt::ShapeSample> * __thiscall
pbrt::Sphere::Sample(optional<pbrt::ShapeSample> *__return_storage_ptr__,Sphere *this,Point2f *u)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  Transform *pTVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Tuple3<pbrt::Point3,_float> local_a8;
  undefined1 local_98 [16];
  float local_7c;
  undefined1 local_78 [16];
  Tuple3<pbrt::Vector3,_float> local_68;
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Point3fi local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_98 = ZEXT416((uint)this->radius);
  auVar6 = vfmadd132ss_fma(ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).x),
                           SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
  local_78._0_4_ = auVar6._0_4_;
  auVar6 = vfnmadd213ss_fma(auVar6,auVar6,SUB6416(ZEXT464(0x3f800000),0));
  auVar6 = vmaxss_avx(auVar6,ZEXT816(0));
  if (auVar6._0_4_ < 0.0) {
    auVar11._0_4_ = sqrtf(auVar6._0_4_);
    auVar11._4_60_ = extraout_var;
    local_58 = auVar11._0_16_;
  }
  else {
    local_58 = vsqrtss_avx(auVar6,auVar6);
  }
  local_7c = (u->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855;
  local_48 = cosf(local_7c);
  uStack_44 = extraout_XMM0_Db;
  uStack_40 = extraout_XMM0_Dc;
  uStack_3c = extraout_XMM0_Dd;
  auVar12._0_4_ = sinf(local_7c);
  auVar12._4_60_ = extraout_var_00;
  auVar6._4_4_ = uStack_44;
  auVar6._0_4_ = local_48;
  auVar6._8_4_ = uStack_40;
  auVar6._12_4_ = uStack_3c;
  auVar6 = vinsertps_avx(auVar6,auVar12._0_16_,0x10);
  auVar8._0_4_ = (float)local_98._0_4_ * (float)local_58._0_4_ * auVar6._0_4_ + 0.0;
  auVar8._4_4_ = (float)local_98._0_4_ * (float)local_58._0_4_ * auVar6._4_4_ + 0.0;
  auVar8._8_4_ = (float)local_98._0_4_ * (float)local_58._0_4_ * auVar6._8_4_ + 0.0;
  auVar8._12_4_ = (float)local_98._0_4_ * (float)local_58._0_4_ * auVar6._12_4_ + 0.0;
  local_a8.z = (float)local_98._0_4_ * (float)local_78._0_4_ + 0.0;
  local_a8._0_8_ = vmovlps_avx(auVar8);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.y * local_a8.y)),ZEXT416((uint)local_a8.x),
                           ZEXT416((uint)local_a8.x));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)local_a8.z),ZEXT416((uint)local_a8.z));
  if (auVar6._0_4_ < 0.0) {
    local_98._0_4_ = this->radius;
    fVar9 = sqrtf(auVar6._0_4_);
    fVar10 = (float)local_98._0_4_;
  }
  else {
    auVar6 = vsqrtss_avx(auVar6,auVar6);
    fVar9 = auVar6._0_4_;
    fVar10 = this->radius;
  }
  fVar10 = fVar10 / fVar9;
  auVar13._0_4_ = local_a8.x * fVar10;
  auVar13._4_4_ = local_a8.y * fVar10;
  auVar13._8_4_ = fVar10 * 0.0;
  auVar13._12_4_ = fVar10 * 0.0;
  local_a8._0_8_ = vmovlps_avx(auVar13);
  local_a8.z = fVar10 * local_a8.z;
  auVar17._8_4_ = 0x7fffffff;
  auVar17._0_8_ = 0x7fffffff7fffffff;
  auVar17._12_4_ = 0x7fffffff;
  auVar19._4_4_ = local_a8.z;
  auVar19._0_4_ = local_a8.z;
  auVar19._8_4_ = local_a8.z;
  auVar19._12_4_ = local_a8.z;
  auVar6 = vandps_avx(auVar19,auVar17);
  auVar8 = vandps_avx(auVar13,auVar17);
  auVar7._8_4_ = 0x34a00003;
  auVar7._0_8_ = 0x34a0000334a00003;
  auVar7._12_4_ = 0x34a00003;
  auVar8 = vmulps_avx512vl(auVar8,auVar7);
  local_68.z = auVar6._0_4_ * 2.980233e-07;
  local_68._0_8_ = vmovlps_avx(auVar8);
  pTVar5 = this->renderFromObject;
  auVar6 = vmovshdup_avx(auVar13);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * (pTVar5->mInv).m[1][2])),auVar13,
                           ZEXT416((uint)(pTVar5->mInv).m[0][2]));
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(pTVar5->mInv).m[0];
  uVar3 = *(undefined8 *)(pTVar5->mInv).m[1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(pTVar5->mInv).m[2];
  auVar18._0_4_ = auVar6._0_4_ * (float)uVar3;
  auVar18._4_4_ = auVar6._4_4_ * (float)((ulong)uVar3 >> 0x20);
  auVar18._8_4_ = auVar6._8_4_ * 0.0;
  auVar18._12_4_ = auVar6._12_4_ * 0.0;
  auVar21._4_4_ = auVar13._0_4_;
  auVar21._0_4_ = auVar13._0_4_;
  auVar21._8_4_ = auVar13._0_4_;
  auVar21._12_4_ = auVar13._0_4_;
  auVar6 = vfmadd213ps_fma(auVar21,auVar20,auVar18);
  local_78 = vfmadd231ps_fma(auVar6,auVar19,auVar22);
  auVar14._0_4_ = local_78._0_4_ * local_78._0_4_;
  auVar14._4_4_ = local_78._4_4_ * local_78._4_4_;
  auVar14._8_4_ = local_78._8_4_ * local_78._8_4_;
  auVar14._12_4_ = local_78._12_4_ * local_78._12_4_;
  auVar6 = vhaddps_avx(auVar14,auVar14);
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)local_a8.z),ZEXT416((uint)(pTVar5->mInv).m[2][2]));
  fVar9 = auVar8._0_4_;
  fVar10 = auVar6._0_4_ + fVar9 * fVar9;
  if (fVar10 < 0.0) {
    local_98._0_4_ = fVar9;
    fVar10 = sqrtf(fVar10);
    auVar8 = ZEXT416((uint)local_98._0_4_);
  }
  else {
    auVar6 = vsqrtss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
    fVar10 = auVar6._0_4_;
  }
  auVar15._4_4_ = fVar10;
  auVar15._0_4_ = fVar10;
  auVar15._8_4_ = fVar10;
  auVar15._12_4_ = fVar10;
  auVar6 = vdivps_avx(local_78,auVar15);
  fVar10 = auVar8._0_4_ / fVar10;
  bVar4 = this->reverseOrientation;
  local_98 = auVar6;
  if (bVar4 != false) {
    local_98._0_8_ = auVar6._0_8_ ^ 0x8000000080000000;
    local_98._8_4_ = auVar6._8_4_ ^ 0x80000000;
    local_98._12_4_ = auVar6._12_4_ ^ 0x80000000;
  }
  local_78._0_4_ = (uint)(bVar4 & 1) * (int)-fVar10 + (uint)!(bool)(bVar4 & 1) * (int)fVar10;
  local_78._4_12_ = auVar8._4_12_;
  pTVar5 = this->renderFromObject;
  Point3fi::Point3fi(&local_38,(Point3f *)&local_a8,(Vector3f *)&local_68);
  Transform::operator()((Point3fi *)__return_storage_ptr__,pTVar5,&local_38);
  fVar10 = this->zMax;
  fVar9 = this->phiMax;
  fVar1 = this->radius;
  fVar2 = this->zMin;
  __return_storage_ptr__->set = true;
  auVar16._0_12_ = ZEXT812(0);
  auVar16._12_4_ = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar16;
  uVar3 = vmovlps_avx(local_98);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar3;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = local_78._0_4_;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x34) = auVar16;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar16;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
       1.0 / (fVar9 * fVar1 * (fVar10 - fVar2));
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeSample> Sphere::Sample(const Point2f &u) const {
    Point3f pObj = Point3f(0, 0, 0) + radius * SampleUniformSphere(u);
    // Reproject _pObj_ to sphere surface and compute _pObjError_
    pObj *= radius / Distance(pObj, Point3f(0, 0, 0));
    Vector3f pObjError = gamma(5) * Abs((Vector3f)pObj);

    // Compute surface normal for sphere sample and return _ShapeSample_
    Normal3f n = Normalize((*renderFromObject)(Normal3f(pObj.x, pObj.y, pObj.z)));
    if (reverseOrientation)
        n *= -1;
    Point3fi pi = (*renderFromObject)(Point3fi(pObj, pObjError));
    return ShapeSample{Interaction(pi, n), 1 / Area()};
}